

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O2

void __thiscall tcu::ThreadUtil::Event::setResult(Event *this,Result result)

{
  int i;
  int iVar1;
  
  de::Mutex::lock(&this->m_lock);
  this->m_result = result;
  de::Mutex::unlock(&this->m_lock);
  for (iVar1 = 0; iVar1 < this->m_waiterCount; iVar1 = iVar1 + 1) {
    de::Semaphore::increment(&this->m_waiters);
  }
  return;
}

Assistant:

void Event::setResult (Result result)
{
	m_lock.lock();
	DE_ASSERT(m_result == RESULT_NOT_READY);
	m_result = result;
	m_lock.unlock();

	for (int i = 0; i < m_waiterCount; i++)
		m_waiters.increment();
}